

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void artrans(int p,double *old,double *new1)

{
  void *__ptr;
  double dVar1;
  double *temp;
  double a;
  int k;
  int j;
  double *new1_local;
  double *old_local;
  int p_local;
  
  __ptr = malloc((long)p << 3);
  for (a._4_4_ = 0; a._4_4_ < p; a._4_4_ = a._4_4_ + 1) {
    dVar1 = tanh(old[a._4_4_]);
    new1[a._4_4_] = dVar1;
    *(double *)((long)__ptr + (long)a._4_4_ * 8) = new1[a._4_4_];
  }
  for (a._4_4_ = 1; a._4_4_ < p; a._4_4_ = a._4_4_ + 1) {
    dVar1 = new1[a._4_4_];
    for (a._0_4_ = 0; a._0_4_ < a._4_4_; a._0_4_ = a._0_4_ + 1) {
      *(double *)((long)__ptr + (long)a._0_4_ * 8) =
           -dVar1 * new1[(a._4_4_ - a._0_4_) + -1] + *(double *)((long)__ptr + (long)a._0_4_ * 8);
    }
    for (a._0_4_ = 0; a._0_4_ < a._4_4_; a._0_4_ = a._0_4_ + 1) {
      new1[a._0_4_] = *(double *)((long)__ptr + (long)a._0_4_ * 8);
    }
  }
  free(__ptr);
  return;
}

Assistant:

void artrans(int p, double *old, double *new1) {
	int j, k;
	double a;
	double *temp;

	temp = (double*)malloc(sizeof(double)* p);

	for (j = 0; j < p; ++j) {
		new1[j] = tanh(old[j]);
		temp[j] = new1[j];
	}

	for (j = 1; j < p; ++j) {
		a = new1[j];
		for (k = 0; k < j; ++k) {
			temp[k] -= a * new1[j - k - 1];
		}
		for (k = 0; k < j; ++k) {
			new1[k] = temp[k];
		}
	}

	free(temp);
}